

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O3

int X509_set1_signature_algo(X509 *x509,X509_ALGOR *algo)

{
  bool bVar1;
  X509_ALGOR *a;
  X509_ALGOR *a_00;
  
  a = X509_ALGOR_dup((X509_ALGOR *)algo);
  a_00 = X509_ALGOR_dup((X509_ALGOR *)algo);
  bVar1 = a_00 != (X509_ALGOR *)0x0 && a != (X509_ALGOR *)0x0;
  if (bVar1) {
    X509_ALGOR_free((X509_ALGOR *)x509->sig_alg);
    x509->sig_alg = (X509_ALGOR *)a;
    X509_ALGOR_free((X509_ALGOR *)x509->cert_info->signature);
    x509->cert_info->signature = (X509_ALGOR *)a_00;
  }
  else {
    X509_ALGOR_free(a);
    X509_ALGOR_free(a_00);
  }
  return (uint)bVar1;
}

Assistant:

int X509_set1_signature_algo(X509 *x509, const X509_ALGOR *algo) {
  X509_ALGOR *copy1 = X509_ALGOR_dup(algo);
  X509_ALGOR *copy2 = X509_ALGOR_dup(algo);
  if (copy1 == NULL || copy2 == NULL) {
    X509_ALGOR_free(copy1);
    X509_ALGOR_free(copy2);
    return 0;
  }

  X509_ALGOR_free(x509->sig_alg);
  x509->sig_alg = copy1;
  X509_ALGOR_free(x509->cert_info->signature);
  x509->cert_info->signature = copy2;
  return 1;
}